

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManComputeDistance(Gia_Man_t *p,int iObj,Vec_Int_t *vObjs,int fVerbose)

{
  Vec_Int_t *local_30;
  Vec_Int_t *vDists;
  int fVerbose_local;
  Vec_Int_t *vObjs_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  if (p->vFanoutNums == (Vec_Int_t *)0x0) {
    Gia_ManStaticFanoutStart(p);
    local_30 = Gia_ManComputeDistanceInt(p,iObj,vObjs,fVerbose);
    Gia_ManStaticFanoutStop(p);
  }
  else {
    local_30 = Gia_ManComputeDistanceInt(p,iObj,vObjs,fVerbose);
  }
  return local_30;
}

Assistant:

Vec_Int_t * Gia_ManComputeDistance( Gia_Man_t * p, int iObj, Vec_Int_t * vObjs, int fVerbose )
{
    Vec_Int_t * vDists;
    if ( p->vFanoutNums )
        vDists = Gia_ManComputeDistanceInt( p, iObj, vObjs, fVerbose );
    else
    {
        Gia_ManStaticFanoutStart( p );
        vDists = Gia_ManComputeDistanceInt( p, iObj, vObjs, fVerbose );
        Gia_ManStaticFanoutStop( p );
    }
    return vDists;
}